

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O3

void __thiscall
CoreML::NeuralNetworkShaper::shapeSequenceRepeatLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  NonlinearityTypeUnion val;
  LogMessage *pLVar1;
  mapped_type *this_00;
  mapped_type *this_01;
  undefined1 *puVar2;
  ShapeRange *pSVar3;
  LogFinisher local_59;
  LogMessage local_58;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  ShapeConstraint::setName
            (this_01,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if (specLayer->_oneof_case_[0] == 0x154) {
    puVar2 = *(undefined1 **)&specLayer->layer_;
  }
  else {
    puVar2 = Specification::_SequenceRepeatLayerParams_default_instance_;
  }
  val = ((ActivationParams *)puVar2)->NonlinearityType_;
  pSVar3 = ShapeConstraint::sequenceRange(this_00);
  ShapeRange::operator*((ShapeRange *)&local_58,pSVar3,(size_t)val);
  ShapeConstraint::updateSequenceRange(this_01,(ShapeRange *)&local_58);
  pSVar3 = ShapeConstraint::batchRange(this_00);
  ShapeConstraint::updateBatchRange(this_01,pSVar3);
  pSVar3 = ShapeConstraint::channelRange(this_00);
  ShapeConstraint::updateChannelRange(this_01,pSVar3);
  pSVar3 = ShapeConstraint::heightRange(this_00);
  ShapeConstraint::updateHeightRange(this_01,pSVar3);
  pSVar3 = ShapeConstraint::widthRange(this_00);
  ShapeConstraint::updateWidthRange(this_01,pSVar3);
  pSVar3 = ShapeConstraint::batchRange(this_01);
  ShapeConstraint::updateBatchRange(this_00,pSVar3);
  pSVar3 = ShapeConstraint::channelRange(this_01);
  ShapeConstraint::updateChannelRange(this_00,pSVar3);
  pSVar3 = ShapeConstraint::heightRange(this_01);
  ShapeConstraint::updateHeightRange(this_00,pSVar3);
  pSVar3 = ShapeConstraint::widthRange(this_01);
  ShapeConstraint::updateWidthRange(this_00,pSVar3);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeSequenceRepeatLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Sequence Repeat layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Sequence Repeat layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

    size_t nout = (size_t)specLayer.sequencerepeat().nrepetitions();
    outputShape.updateSequenceRange(inputShape.sequenceRange() * nout);
    outputShape.updateBatchRange(inputShape.batchRange());
    outputShape.updateChannelRange(inputShape.channelRange());
    outputShape.updateHeightRange(inputShape.heightRange());
    outputShape.updateWidthRange(inputShape.widthRange());

    // Pass constraints back up as well
    inputShape.updateBatchRange(outputShape.batchRange());
    inputShape.updateChannelRange(outputShape.channelRange());
    inputShape.updateHeightRange(outputShape.heightRange());
    inputShape.updateWidthRange(outputShape.widthRange());

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Sequence Repeat layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Sequence Repeat layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}